

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

int __thiscall
google::protobuf::Reflection::FieldSize(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  RepeatedField<long> *this_01;
  RepeatedField<unsigned_int> *this_02;
  RepeatedField<unsigned_long> *this_03;
  RepeatedField<double> *this_04;
  RepeatedField<float> *this_05;
  RepeatedField<bool> *this_06;
  RepeatedField<int> *pRVar5;
  RepeatedPtrFieldBase *pRVar6;
  LogMessage *this_07;
  FieldDescriptor *field_00;
  FieldDescriptor *in_RDX;
  Reflection *in_RDI;
  char *unaff_retaddr;
  FieldDescriptor *in_stack_00000008;
  Descriptor *in_stack_00000010;
  MapFieldBase *map;
  Message *in_stack_ffffffffffffff68;
  LogMessage *other;
  Reflection *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  LogMessage *in_stack_ffffffffffffff80;
  LogMessage local_60;
  MapFieldBase *local_28;
  FieldDescriptor *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar7;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_20 = in_RDX;
  pDVar4 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar4 != in_RDI->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,
               (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  LVar2 = FieldDescriptor::label(local_20);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,
               (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  bVar1 = FieldDescriptor::is_extension(local_20);
  if (bVar1) {
    this_00 = GetExtensionSet(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    FieldDescriptor::number(local_20);
    iVar7 = internal::ExtensionSet::ExtensionSize(this_00,iVar7);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x415c7f);
    field_00 = (FieldDescriptor *)(ulong)(CVar3 - CPPTYPE_INT32);
    switch(field_00) {
    case (FieldDescriptor *)0x0:
      pRVar5 = GetRaw<google::protobuf::RepeatedField<int>>
                         (in_RDI,(Message *)in_stack_ffffffffffffff80,field_00);
      iVar7 = RepeatedField<int>::size(pRVar5);
      break;
    case (FieldDescriptor *)0x1:
      this_01 = GetRaw<google::protobuf::RepeatedField<long>>
                          (in_RDI,(Message *)in_stack_ffffffffffffff80,field_00);
      iVar7 = RepeatedField<long>::size(this_01);
      break;
    case (FieldDescriptor *)0x2:
      this_02 = GetRaw<google::protobuf::RepeatedField<unsigned_int>>
                          (in_RDI,(Message *)in_stack_ffffffffffffff80,field_00);
      iVar7 = RepeatedField<unsigned_int>::size(this_02);
      break;
    case (FieldDescriptor *)0x3:
      this_03 = GetRaw<google::protobuf::RepeatedField<unsigned_long>>
                          (in_RDI,(Message *)in_stack_ffffffffffffff80,field_00);
      iVar7 = RepeatedField<unsigned_long>::size(this_03);
      break;
    case (FieldDescriptor *)0x4:
      this_04 = GetRaw<google::protobuf::RepeatedField<double>>
                          (in_RDI,(Message *)in_stack_ffffffffffffff80,field_00);
      iVar7 = RepeatedField<double>::size(this_04);
      break;
    case (FieldDescriptor *)0x5:
      this_05 = GetRaw<google::protobuf::RepeatedField<float>>
                          (in_RDI,(Message *)in_stack_ffffffffffffff80,field_00);
      iVar7 = RepeatedField<float>::size(this_05);
      break;
    case (FieldDescriptor *)0x6:
      this_06 = GetRaw<google::protobuf::RepeatedField<bool>>
                          (in_RDI,(Message *)in_stack_ffffffffffffff80,field_00);
      iVar7 = RepeatedField<bool>::size(this_06);
      break;
    case (FieldDescriptor *)0x7:
      pRVar5 = GetRaw<google::protobuf::RepeatedField<int>>
                         (in_RDI,(Message *)in_stack_ffffffffffffff80,field_00);
      iVar7 = RepeatedField<int>::size(pRVar5);
      break;
    case (FieldDescriptor *)0x8:
    case (FieldDescriptor *)0x9:
      bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x415e08);
      if (bVar1) {
        local_28 = GetRaw<google::protobuf::internal::MapFieldBase>
                             (in_RDI,(Message *)in_stack_ffffffffffffff80,field_00);
        bVar1 = internal::MapFieldBase::IsRepeatedFieldValid
                          ((MapFieldBase *)in_stack_ffffffffffffff70);
        if (bVar1) {
          pRVar6 = internal::MapFieldBase::GetRepeatedField
                             ((MapFieldBase *)in_stack_ffffffffffffff70);
          iVar7 = internal::RepeatedPtrFieldBase::size(pRVar6);
        }
        else {
          iVar7 = (*local_28->_vptr_MapFieldBase[10])();
        }
      }
      else {
        pRVar6 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                           (in_RDI,(Message *)in_stack_ffffffffffffff80,field_00);
        iVar7 = internal::RepeatedPtrFieldBase::size(pRVar6);
      }
      break;
    default:
      other = &local_60;
      internal::LogMessage::LogMessage
                (in_stack_ffffffffffffff80,LOGLEVEL_INFO,(char *)in_stack_ffffffffffffff70,
                 (int)((ulong)other >> 0x20));
      this_07 = internal::LogMessage::operator<<
                          ((LogMessage *)in_stack_ffffffffffffff70,(char *)other);
      internal::LogFinisher::operator=((LogFinisher *)this_07,other);
      internal::LogMessage::~LogMessage((LogMessage *)0x415ee8);
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int Reflection::FieldSize(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(FieldSize);
  USAGE_CHECK_REPEATED(FieldSize);

  if (field->is_extension()) {
    return GetExtensionSet(message).ExtensionSize(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)    \
  case FieldDescriptor::CPPTYPE_##UPPERCASE: \
    return GetRaw<RepeatedField<LOWERCASE> >(message, field).size()

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          const internal::MapFieldBase& map =
              GetRaw<MapFieldBase>(message, field);
          if (map.IsRepeatedFieldValid()) {
            return map.GetRepeatedField().size();
          } else {
            // No need to materialize the repeated field if it is out of sync:
            // its size will be the same as the map's size.
            return map.size();
          }
        } else {
          return GetRaw<RepeatedPtrFieldBase>(message, field).size();
        }
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }
}